

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

bov_order_t *
bov_order_partial_update(bov_order_t *order,GLuint *elements,GLint start,GLsizei count,GLsizei newN)

{
  int iVar1;
  
  if (elements == (GLuint *)0x0) {
    bov_order_partial_update_cold_2();
  }
  else {
    if (newN == 0) {
      newN = order->eboLen;
    }
    if (newN < count + start) {
      newN = count + start;
    }
    iVar1 = 0x7fffffff;
    if (-1 < start) {
      iVar1 = newN;
    }
    if (iVar1 <= order->eboCapacity) {
      order->eboLen = iVar1;
      if (count == 0) {
        return order;
      }
      (*glad_glBindBuffer)(0x8893,order->ebo);
      (*glad_glBufferSubData)(0x8893,(long)start,(long)count << 2,elements);
      return order;
    }
    bov_order_partial_update_cold_1();
  }
  return (bov_order_t *)0x0;
}

Assistant:

bov_order_t* bov_order_partial_update(bov_order_t* order, const GLuint* elements,
                              GLint start, GLsizei count, GLsizei newN)
{
	if(elements==NULL) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update whith a NULL "
		              "pointer as array of elements");
		return NULL;
	}

	if(newN==0)
		newN = order->eboLen;

	if(start + count > newN)
		newN = start+count;
	if(start + count < count) // detect overflow
		newN = BOV_TILL_END;

	if(newN > order->eboCapacity) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update when the new "
		              "size is bigger than the capacity of the "
		              "buffer");
		return NULL;
	}

	// if it is restored to a previous capacity, fill buffer with zeros
	// if(newN > order->eboLen) {
	//     glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	//     GLint offset = (GLint) order->eboLen;
	//     GLsizei len = newN - order->eboLen;
	//     GLuint* zeros = calloc(len, sizeof(GLuint));
	//     CHECK_MALLOC(zeros);
	//     glBufferSubData(GL_ELEMENT_ARRAY_BUFFER, offset, sizeof(GLuint) * len, zeros);
	//     free(zeros);
	// }

	order->eboLen = newN;

	if(count==0)
		return order;

	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	glBufferSubData(GL_ELEMENT_ARRAY_BUFFER,
	                start,
	                sizeof(GLuint) * count,
	                elements);
	return order;
}